

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::SetLiteralRegex(FunctionBody *this,uint index,RegexPattern *pattern)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  RegexPattern **ppRVar6;
  Type *literalRegexes;
  RegexPattern *pattern_local;
  uint index_local;
  FunctionBody *this_local;
  
  uVar3 = GetLiteralRegexCount(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b7,"(index < GetLiteralRegexCount())",
                                "index < GetLiteralRegexCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pTVar5 = GetLiteralRegexes(this);
  if (pTVar5 == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b8,"(this->GetLiteralRegexes())","this->GetLiteralRegexes()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pTVar5 = GetLiteralRegexes(this);
  ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__
                      ((WriteBarrierPtr *)(pTVar5 + index));
  if ((*ppRVar6 == (RegexPattern *)0x0) ||
     (ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__
                          ((WriteBarrierPtr *)(pTVar5 + index)), *ppRVar6 != pattern)) {
    ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__
                        ((WriteBarrierPtr *)(pTVar5 + index));
    if (*ppRVar6 != (RegexPattern *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x19bf,"(!literalRegexes[index])","!literalRegexes[index]");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator=(pTVar5 + index,pattern);
  }
  return;
}

Assistant:

void FunctionBody::SetLiteralRegex(const uint index, UnifiedRegex::RegexPattern *const pattern)
    {
        Assert(index < GetLiteralRegexCount());
        Assert(this->GetLiteralRegexes());

        auto literalRegexes = this->GetLiteralRegexes();
        if (literalRegexes[index] && literalRegexes[index] == pattern)
        {
            return;
        }
        Assert(!literalRegexes[index]);

        literalRegexes[index] = pattern;
    }